

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_compensation.cpp
# Opt level: O0

void mc::subtract_block(TRIPLEYCbCr **base,TRIPLEYCbCr **target,TRIPLEYCbCr **out,block_info block,
                       vect v)

{
  uint8_t uVar1;
  int local_30;
  int local_2c;
  int j;
  int i;
  TRIPLEYCbCr **out_local;
  TRIPLEYCbCr **target_local;
  TRIPLEYCbCr **base_local;
  vect v_local;
  
  for (local_2c = 0; (ulong)(long)local_2c < block.height; local_2c = local_2c + 1) {
    for (local_30 = 0; (ulong)(long)local_30 < block.width; local_30 = local_30 + 1) {
      base_local._4_4_ = v.y;
      base_local._0_4_ = v.x;
      uVar1 = clip((target[block.super_pos.y + (long)local_2c][block.super_pos.x + (long)local_30].Y
                   + 0x80) - (uint)base[block.super_pos.y + (long)base_local._4_4_ + (long)local_2c]
                                   [block.super_pos.x + (long)(int)base_local + (long)local_30].Y,
                   '\0',0xff);
      out[block.super_pos.y + (long)local_2c][block.super_pos.x + (long)local_30].Y = uVar1;
    }
  }
  return;
}

Assistant:

void mc::subtract_block(TRIPLEYCbCr **base, TRIPLEYCbCr **target, TRIPLEYCbCr **out, mc::block_info block, mc::vect v) {
    for (int i = 0; i < block.height; i++) {
        for (int j = 0; j < block.width; j++) {
            out[block.y + i][block.x + j].Y = clip(
                    128 + target[block.y + i][block.x + j].Y - base[block.y + v.y + i][block.x + v.x + j].Y,
                    0,
                    255);
        }
    }
}